

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O0

void __thiscall
Jupiter::GenericCommandNamespace::~GenericCommandNamespace(GenericCommandNamespace *this)

{
  GenericCommandNamespace *this_local;
  
  (this->super_GenericCommand).super_Command._vptr_Command = (_func_int **)&PTR_getHelp_001ea1c8;
  std::__cxx11::string::~string((string *)&this->m_help);
  std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::~vector
            (&this->m_commands);
  GenericCommand::~GenericCommand(&this->super_GenericCommand);
  return;
}

Assistant:

Jupiter::GenericCommandNamespace::~GenericCommandNamespace() {
}